

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

void __thiscall
burst::algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>::
bitap<std::__cxx11::string>
          (bitap<char,unsigned_short,std::array<unsigned_short,256ul>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern)

{
  element_type *this_00;
  size_t sVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern_local;
  bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> *this_local;
  
  local_18 = pattern;
  pattern_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::
  make_shared<burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,256ul>>const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,&local_20);
  this_00 = std::
            __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  sVar1 = algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>::
          length(this_00);
  if (sVar1 < 0x11) {
    return;
  }
  __assert_fail("m_bitmask_table->length() <= bitmask_size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/searching/bitap.hpp"
                ,0x4c,
                "burst::algorithm::bitap<char, unsigned short>::bitap(const ForwardRange &) [Value = char, Bitmask = unsigned short, Map = std::array<unsigned short, 256>, ForwardRange = std::basic_string<char>]"
               );
}

Assistant:

explicit bitap (const ForwardRange & pattern):
                m_bitmask_table
                (
                    std::make_shared<const bitmask_table_type>(pattern.begin(), pattern.end())
                )
            {
                BOOST_ASSERT(m_bitmask_table->length() <= bitmask_size);
            }